

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeWalkerImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMTreeWalkerImpl::nextNode(DOMTreeWalkerImpl *this)

{
  DOMNode *pDVar1;
  DOMNode *local_28;
  DOMNode *parent;
  DOMNode *node;
  DOMTreeWalkerImpl *this_local;
  
  if (this->fCurrentNode == (DOMNode *)0x0) {
    this_local = (DOMTreeWalkerImpl *)0x0;
  }
  else {
    this_local = (DOMTreeWalkerImpl *)getFirstChild(this,this->fCurrentNode);
    if (this_local == (DOMTreeWalkerImpl *)0x0) {
      parent = getNextSibling(this,this->fCurrentNode);
      if ((DOMTreeWalkerImpl *)parent == (DOMTreeWalkerImpl *)0x0) {
        local_28 = getParentNode(this,this->fCurrentNode);
        while (local_28 != (DOMNode *)0x0) {
          pDVar1 = getNextSibling(this,local_28);
          if (pDVar1 != (DOMNode *)0x0) {
            this->fCurrentNode = pDVar1;
            return pDVar1;
          }
          local_28 = getParentNode(this,local_28);
          parent = (DOMNode *)0x0;
        }
        this_local = (DOMTreeWalkerImpl *)parent;
      }
      else {
        this->fCurrentNode = parent;
        this_local = (DOMTreeWalkerImpl *)parent;
      }
    }
    else {
      this->fCurrentNode = (DOMNode *)this_local;
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMTreeWalkerImpl::nextNode () {

    if (!fCurrentNode) return 0;

    DOMNode* node = getFirstChild(fCurrentNode);

    if (node != 0) {
        fCurrentNode = node;
        return node;
    }
    else {

        node = getNextSibling(fCurrentNode);

        if (node != 0) {
            fCurrentNode = node;
            return node;
        }
        else {

            // return parent's 1st sibling.
            DOMNode* parent = getParentNode(fCurrentNode);
            while ( parent != 0) {
                node = getNextSibling(parent);
                if (node != 0) {
                    fCurrentNode = node;
                    return node;
                } else {
                    parent = getParentNode(parent);
                }
            }
            return node;
        }
    }
}